

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSpeedup.c
# Opt level: O1

Abc_Ntk_t *
Abc_NtkPowerdown(Abc_Ntk_t *pNtk,int fUseLutLib,int Percentage,int Degree,int fVerbose,
                int fVeryVerbose)

{
  uint uVar1;
  int *__ptr;
  long *plVar2;
  Abc_Obj_t *pNode;
  void *pvVar3;
  undefined8 *puVar4;
  float fVar5;
  uint uVar6;
  Vec_Int_t *vProbs;
  void *__s;
  Abc_Ntk_t *pAig;
  Vec_Ptr_t *vTimes;
  void **ppvVar7;
  Vec_Ptr_t *vLeaves;
  Vec_Ptr_t *pVVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  char *pcVar16;
  uint uVar17;
  long lVar18;
  float *pProb;
  uint local_9c;
  int local_84;
  
  vProbs = Abc_NtkPowerEstimate(pNtk,0);
  __ptr = vProbs->pArray;
  if (fVerbose != 0) {
    Abc_NtkPowerPrint(pNtk,vProbs);
  }
  pVVar8 = pNtk->vObjs;
  lVar18 = (long)pVVar8->nSize;
  __s = malloc(lVar18 * 4);
  local_9c = 0;
  memset(__s,0,lVar18 * 4);
  if (0 < lVar18) {
    fVar5 = (float)Percentage / -100.0 + 0.5;
    ppvVar7 = pVVar8->pArray;
    lVar15 = 0;
    do {
      plVar2 = (long *)ppvVar7[lVar15];
      if (((plVar2 != (long *)0x0) && ((*(uint *)((long)plVar2 + 0x14) & 0xf) == 7)) &&
         (fVar5 < (float)__ptr[(int)plVar2[2]] || fVar5 == (float)__ptr[(int)plVar2[2]])) {
        if ((long)*(int *)((long)plVar2 + 0x1c) < 1) {
          uVar17 = 0;
        }
        else {
          lVar9 = 0;
          uVar17 = 0;
          do {
            uVar12 = 1 << ((byte)lVar9 & 0x1f);
            if ((float)__ptr[*(int *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                               (long)*(int *)(plVar2[4] + lVar9 * 4) * 8) + 0x10)] <
                fVar5) {
              uVar12 = 0;
            }
            uVar17 = uVar17 | uVar12;
            lVar9 = lVar9 + 1;
          } while (*(int *)((long)plVar2 + 0x1c) != lVar9);
        }
        *(uint *)((long)__s + (long)(int)plVar2[2] * 4) = uVar17;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != lVar18);
  }
  pAig = Abc_NtkStrash(pNtk,0,1,0);
  vTimes = (Vec_Ptr_t *)malloc(0x10);
  vTimes->nCap = 0x10;
  vTimes->nSize = 0;
  ppvVar7 = (void **)malloc(0x80);
  vTimes->pArray = ppvVar7;
  vLeaves = (Vec_Ptr_t *)malloc(0x10);
  vLeaves->nCap = 0x10;
  vLeaves->nSize = 0;
  ppvVar7 = (void **)malloc(0x80);
  vLeaves->pArray = ppvVar7;
  pVVar8 = pNtk->vObjs;
  local_84 = 0;
  if (0 < pVVar8->nSize) {
    lVar18 = 0;
    local_84 = 0;
    local_9c = 0;
    do {
      pNode = (Abc_Obj_t *)pVVar8->pArray[lVar18];
      if ((pNode != (Abc_Obj_t *)0x0) && ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) {
        lVar15 = (long)(pNode->vFanins).nSize;
        if (lVar15 < 1) {
          uVar17 = 0;
        }
        else {
          lVar9 = 0;
          uVar17 = 0;
          do {
            uVar12 = *(uint *)((long)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar9]] +
                              0x14) & 0xf;
            if ((uVar12 != 2) && (uVar12 != 5)) {
              uVar17 = uVar17 + ((*(uint *)((long)__s + (long)pNode->Id * 4) >> ((uint)lVar9 & 0x1f)
                                 & 1) != 0);
            }
            lVar9 = lVar9 + 1;
          } while (lVar15 != lVar9);
        }
        if (fVeryVerbose != 0 || uVar17 != 0) {
          vTimes->nSize = 0;
          if ((uVar17 != 0) && (0 < (pNode->vFanins).nSize)) {
            lVar15 = 0;
            do {
              plVar2 = (long *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar15]];
              uVar12 = *(uint *)((long)plVar2 + 0x14) & 0xf;
              if ((((uVar12 != 2) && (uVar12 != 5)) &&
                  ((*(uint *)((long)__s + (long)pNode->Id * 4) >> ((uint)lVar15 & 0x1f) & 1) != 0))
                 && (0 < *(int *)((long)plVar2 + 0x1c))) {
                lVar9 = 0;
                do {
                  if ((*(uint *)((long)__s + (long)(int)plVar2[2] * 4) >> ((uint)lVar9 & 0x1f) & 1)
                      != 0) {
                    pvVar3 = *(void **)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                       (long)*(int *)(plVar2[4] + lVar9 * 4) * 8);
                    uVar12 = vTimes->nSize;
                    lVar14 = (long)(int)uVar12;
                    if (0 < lVar14) {
                      lVar10 = 0;
                      do {
                        if (vTimes->pArray[lVar10] == pvVar3) goto LAB_00312bea;
                        lVar10 = lVar10 + 1;
                      } while (lVar14 != lVar10);
                    }
                    uVar6 = vTimes->nCap;
                    if (uVar12 == uVar6) {
                      if ((int)uVar6 < 0x10) {
                        if (vTimes->pArray == (void **)0x0) {
                          ppvVar7 = (void **)malloc(0x80);
                        }
                        else {
                          ppvVar7 = (void **)realloc(vTimes->pArray,0x80);
                        }
                        iVar13 = 0x10;
                      }
                      else {
                        iVar13 = uVar6 * 2;
                        if (iVar13 <= (int)uVar6) goto LAB_00312bdb;
                        if (vTimes->pArray == (void **)0x0) {
                          ppvVar7 = (void **)malloc((ulong)uVar6 << 4);
                        }
                        else {
                          ppvVar7 = (void **)realloc(vTimes->pArray,(ulong)uVar6 << 4);
                        }
                      }
                      vTimes->pArray = ppvVar7;
                      vTimes->nCap = iVar13;
                    }
LAB_00312bdb:
                    vTimes->nSize = uVar12 + 1;
                    vTimes->pArray[lVar14] = pvVar3;
                  }
LAB_00312bea:
                  lVar9 = lVar9 + 1;
                } while (lVar9 < *(int *)((long)plVar2 + 0x1c));
              }
              lVar15 = lVar15 + 1;
            } while (lVar15 < (pNode->vFanins).nSize);
          }
          local_9c = local_9c + 1;
          uVar12 = vTimes->nSize;
          if ((int)uVar12 <= Degree && uVar12 != 0) {
            vLeaves->nSize = 0;
            if (0 < (pNode->vFanins).nSize) {
              lVar15 = 0;
              do {
                plVar2 = (long *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar15]];
                uVar6 = *(uint *)((long)plVar2 + 0x14) & 0xf;
                if ((uVar6 == 2) || (uVar6 == 5)) {
                  uVar6 = vLeaves->nSize;
                  lVar9 = (long)(int)uVar6;
                  if (0 < lVar9) {
                    lVar14 = 0;
                    do {
                      if ((long *)vLeaves->pArray[lVar14] == plVar2) goto LAB_00312e32;
                      lVar14 = lVar14 + 1;
                    } while (lVar9 != lVar14);
                  }
                  uVar1 = vLeaves->nCap;
                  if (uVar6 == uVar1) {
                    if ((int)uVar1 < 0x10) {
                      if (vLeaves->pArray == (void **)0x0) {
                        ppvVar7 = (void **)malloc(0x80);
                      }
                      else {
                        ppvVar7 = (void **)realloc(vLeaves->pArray,0x80);
                      }
                      iVar13 = 0x10;
                    }
                    else {
                      iVar13 = uVar1 * 2;
                      if (iVar13 <= (int)uVar1) goto LAB_00312e21;
                      if (vLeaves->pArray == (void **)0x0) {
                        ppvVar7 = (void **)malloc((ulong)uVar1 << 4);
                      }
                      else {
                        ppvVar7 = (void **)realloc(vLeaves->pArray,(ulong)uVar1 << 4);
                      }
                    }
                    vLeaves->pArray = ppvVar7;
                    vLeaves->nCap = iVar13;
                  }
LAB_00312e21:
                  vLeaves->nSize = uVar6 + 1;
                  vLeaves->pArray[lVar9] = plVar2;
                }
                else if (0 < *(int *)((long)plVar2 + 0x1c)) {
                  uVar6 = vLeaves->nSize;
                  lVar9 = 0;
                  do {
                    pvVar3 = *(void **)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                       (long)*(int *)(plVar2[4] + lVar9 * 4) * 8);
                    if (0 < (int)uVar6) {
                      uVar11 = 0;
                      do {
                        if (vLeaves->pArray[uVar11] == pvVar3) goto LAB_00312da6;
                        uVar11 = uVar11 + 1;
                      } while (uVar6 != uVar11);
                    }
                    uVar1 = vLeaves->nCap;
                    if (uVar6 == uVar1) {
                      if ((int)uVar1 < 0x10) {
                        if (vLeaves->pArray == (void **)0x0) {
                          ppvVar7 = (void **)malloc(0x80);
                        }
                        else {
                          ppvVar7 = (void **)realloc(vLeaves->pArray,0x80);
                        }
                        iVar13 = 0x10;
                      }
                      else {
                        iVar13 = uVar1 * 2;
                        if (iVar13 <= (int)uVar1) goto LAB_00312d98;
                        if (vLeaves->pArray == (void **)0x0) {
                          ppvVar7 = (void **)malloc((ulong)uVar1 << 4);
                        }
                        else {
                          ppvVar7 = (void **)realloc(vLeaves->pArray,(ulong)uVar1 << 4);
                        }
                      }
                      vLeaves->pArray = ppvVar7;
                      vLeaves->nCap = iVar13;
                    }
LAB_00312d98:
                    lVar14 = (long)(int)uVar6;
                    uVar6 = uVar6 + 1;
                    vLeaves->pArray[lVar14] = pvVar3;
LAB_00312da6:
                    lVar9 = lVar9 + 1;
                  } while (lVar9 < *(int *)((long)plVar2 + 0x1c));
                  vLeaves->nSize = uVar6;
                }
LAB_00312e32:
                lVar15 = lVar15 + 1;
              } while (lVar15 < (pNode->vFanins).nSize);
            }
            if (fVeryVerbose != 0) {
              printf("%5d Node %5d : %d %2d %2d  ",(ulong)local_9c,(ulong)(uint)pNode->Id,
                     (ulong)uVar17,(ulong)uVar12,(ulong)(uint)vLeaves->nSize);
              if (0 < (pNode->vFanins).nSize) {
                lVar15 = 0;
                do {
                  lVar9 = (long)*(int *)((long)pNode->pNtk->vObjs->pArray
                                               [(pNode->vFanins).pArray[lVar15]] + 0x10);
                  pcVar16 = "*";
                  if ((*(uint *)((long)__s + (long)pNode->Id * 4) >> ((uint)lVar15 & 0x1f) & 1) == 0
                     ) {
                    pcVar16 = "";
                  }
                  printf("%d(%.2f)%s ",(double)(float)__ptr[lVar9],lVar9,pcVar16);
                  lVar15 = lVar15 + 1;
                } while (lVar15 < (pNode->vFanins).nSize);
              }
              putchar(10);
            }
            if (1 < (int)uVar12) {
              ppvVar7 = vTimes->pArray;
              pvVar3 = *ppvVar7;
              if ((float)__ptr[*(int *)((long)ppvVar7[1] + 0x10)] <=
                  (float)__ptr[*(int *)((long)pvVar3 + 0x10)] &&
                  (float)__ptr[*(int *)((long)pvVar3 + 0x10)] !=
                  (float)__ptr[*(int *)((long)ppvVar7[1] + 0x10)]) {
                *ppvVar7 = ppvVar7[1];
                ppvVar7[1] = pvVar3;
              }
            }
            if (2 < (int)uVar12) {
              ppvVar7 = vTimes->pArray;
              pvVar3 = ppvVar7[1];
              if ((float)__ptr[*(int *)((long)ppvVar7[2] + 0x10)] <=
                  (float)__ptr[*(int *)((long)pvVar3 + 0x10)] &&
                  (float)__ptr[*(int *)((long)pvVar3 + 0x10)] !=
                  (float)__ptr[*(int *)((long)ppvVar7[2] + 0x10)]) {
                if ((int)uVar12 < 2) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                                ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
                }
                ppvVar7[1] = ppvVar7[2];
                ppvVar7[2] = pvVar3;
              }
              if ((int)uVar12 < 2) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                              ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
              }
              pvVar3 = *ppvVar7;
              if ((float)__ptr[*(int *)((long)ppvVar7[1] + 0x10)] <=
                  (float)__ptr[*(int *)((long)pvVar3 + 0x10)] &&
                  (float)__ptr[*(int *)((long)pvVar3 + 0x10)] !=
                  (float)__ptr[*(int *)((long)ppvVar7[1] + 0x10)]) {
                *ppvVar7 = ppvVar7[1];
                ppvVar7[1] = pvVar3;
              }
            }
            local_84 = local_84 + 1;
            Abc_NtkSpeedupNode((Abc_Ntk_t *)(ulong)uVar12,pAig,pNode,vLeaves,vTimes);
          }
        }
      }
      lVar18 = lVar18 + 1;
      pVVar8 = pNtk->vObjs;
    } while (lVar18 < pVVar8->nSize);
  }
  if (vTimes->pArray != (void **)0x0) {
    free(vTimes->pArray);
    vTimes->pArray = (void **)0x0;
  }
  free(vTimes);
  if (vLeaves->pArray != (void **)0x0) {
    free(vLeaves->pArray);
    vLeaves->pArray = (void **)0x0;
  }
  free(vLeaves);
  if (__s != (void *)0x0) {
    free(__s);
  }
  if (fVerbose != 0) {
    printf("Nodes: Total = %7d. Power-critical = %7d. Workable = %7d. Ratio = %4.2f\n",
           (double)local_84 / (double)(int)local_9c,(ulong)(uint)pNtk->nObjCounts[7]);
  }
  pVVar8 = pAig->vObjs;
  if (0 < pVVar8->nSize) {
    lVar18 = 0;
    do {
      puVar4 = (undefined8 *)pVVar8->pArray[lVar18];
      if (puVar4 != (undefined8 *)0x0) {
        if (((ulong)puVar4 & 1) != 0) {
          pcVar16 = "!Abc_ObjIsComplement(pNode)";
LAB_0031310f:
          __assert_fail(pcVar16,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                        ,399,"int Abc_AigNodeIsAnd(Abc_Obj_t *)");
        }
        if (*(int *)*puVar4 != 3) {
          pcVar16 = "Abc_NtkIsStrash(pNode->pNtk)";
          goto LAB_0031310f;
        }
        if (((*(int *)((long)puVar4 + 0x1c) == 2) && (puVar4[7] != 0)) &&
           (0 < *(int *)(puVar4[7] + 0x2c))) {
          puVar4[7] = 0;
        }
      }
      lVar18 = lVar18 + 1;
      pVVar8 = pAig->vObjs;
    } while (lVar18 < pVVar8->nSize);
  }
  if (__ptr != (int *)0x0) {
    free(__ptr);
    vProbs->pArray = (int *)0x0;
  }
  if (vProbs != (Vec_Int_t *)0x0) {
    free(vProbs);
  }
  return pAig;
}

Assistant:

Abc_Ntk_t * Abc_NtkPowerdown( Abc_Ntk_t * pNtk, int fUseLutLib, int Percentage, int Degree, int fVerbose, int fVeryVerbose )
{
    Abc_Ntk_t * pNtkNew;
    Vec_Int_t * vProbs;
    Vec_Ptr_t * vTimeCries, * vTimeFanins;
    Abc_Obj_t * pNode, * pFanin, * pFanin2;
    float * pProb, Limit;
    int i, k, k2, Counter, CounterRes, nTimeCris;
    unsigned * puPCEdges;
    // compute the limit
    Limit = 0.5 - (1.0 * Percentage / 100);
    // perform computation of switching probability
    vProbs = Abc_NtkPowerEstimate( pNtk, 0 );
    pProb = (float *)vProbs->pArray;
    // compute percentage of wires of each type
    if ( fVerbose )
        Abc_NtkPowerPrint( pNtk, vProbs );
    // mark the power critical nodes and edges
    puPCEdges = ABC_ALLOC( unsigned, Abc_NtkObjNumMax(pNtk) );
    memset( puPCEdges, 0, sizeof(unsigned) * Abc_NtkObjNumMax(pNtk) );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( pProb[pNode->Id] < Limit )
            continue;
        puPCEdges[pNode->Id] = Abc_NtkPowerCriticalEdges( pNtk, pNode, Limit, vProbs );
    }
/*
    if ( fVerbose )
    {
        Counter = CounterRes = 0;
        Abc_NtkForEachNode( pNtk, pNode, i )
        {
            Counter += Abc_ObjFaninNum(pNode);
            CounterRes += Extra_WordCountOnes( puPCEdges[pNode->Id] );
        }
        printf( "Edges: Total = %7d. Critical = %7d. Ratio = %4.2f\n", 
            Counter, CounterRes, 1.0*CounterRes/Counter );
    }
*/
    // start the resulting network
    pNtkNew = Abc_NtkStrash( pNtk, 0, 1, 0 );

    // collect nodes to be used for resynthesis
    Counter = CounterRes = 0;
    vTimeCries = Vec_PtrAlloc( 16 );
    vTimeFanins = Vec_PtrAlloc( 16 );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
//        if ( pProb[pNode->Id] < Limit )
//            continue;
        // count the number of non-PI power-critical nodes
        nTimeCris = 0;
        Abc_ObjForEachFanin( pNode, pFanin, k )
            if ( !Abc_ObjIsCi(pFanin) && (puPCEdges[pNode->Id] & (1<<k)) )
                nTimeCris++;
        if ( !fVeryVerbose && nTimeCris == 0 )
            continue;
        Counter++;
        // count the total number of power-critical second-generation nodes
        Vec_PtrClear( vTimeCries );
        if ( nTimeCris )
        {
            Abc_ObjForEachFanin( pNode, pFanin, k )
                if ( !Abc_ObjIsCi(pFanin) && (puPCEdges[pNode->Id] & (1<<k)) )
                    Abc_ObjForEachFanin( pFanin, pFanin2, k2 )
                        if ( puPCEdges[pFanin->Id] & (1<<k2) )
                            Vec_PtrPushUnique( vTimeCries, pFanin2 );
        }
//        if ( !fVeryVerbose && (Vec_PtrSize(vTimeCries) == 0 || Vec_PtrSize(vTimeCries) > Degree) )
        if ( (Vec_PtrSize(vTimeCries) == 0 || Vec_PtrSize(vTimeCries) > Degree) )
            continue;
        CounterRes++;
        // collect second generation nodes
        Vec_PtrClear( vTimeFanins );
        Abc_ObjForEachFanin( pNode, pFanin, k )
        {
            if ( Abc_ObjIsCi(pFanin) )
                Vec_PtrPushUnique( vTimeFanins, pFanin );
            else
                Abc_ObjForEachFanin( pFanin, pFanin2, k2 )
                    Vec_PtrPushUnique( vTimeFanins, pFanin2 );                    
        }
        // print the results
        if ( fVeryVerbose )
        {
        printf( "%5d Node %5d : %d %2d %2d  ", Counter, pNode->Id, 
            nTimeCris, Vec_PtrSize(vTimeCries), Vec_PtrSize(vTimeFanins) );
        Abc_ObjForEachFanin( pNode, pFanin, k )
            printf( "%d(%.2f)%s ", pFanin->Id, pProb[pFanin->Id], (puPCEdges[pNode->Id] & (1<<k))? "*":"" );
        printf( "\n" );
        }
        // add the node to choices
        if ( Vec_PtrSize(vTimeCries) == 0 || Vec_PtrSize(vTimeCries) > Degree )
            continue;
        // order the fanins in the increasing order of criticalily
        if ( Vec_PtrSize(vTimeCries) > 1 )
        {
            pFanin = (Abc_Obj_t *)Vec_PtrEntry( vTimeCries, 0 );
            pFanin2 = (Abc_Obj_t *)Vec_PtrEntry( vTimeCries, 1 );
//            if ( Abc_ObjSlack(pFanin) < Abc_ObjSlack(pFanin2) )
            if ( pProb[pFanin->Id] > pProb[pFanin2->Id] )
            {
                Vec_PtrWriteEntry( vTimeCries, 0, pFanin2 );
                Vec_PtrWriteEntry( vTimeCries, 1, pFanin );
            }
        }
        if ( Vec_PtrSize(vTimeCries) > 2 )
        {
            pFanin = (Abc_Obj_t *)Vec_PtrEntry( vTimeCries, 1 );
            pFanin2 = (Abc_Obj_t *)Vec_PtrEntry( vTimeCries, 2 );
//            if ( Abc_ObjSlack(pFanin) < Abc_ObjSlack(pFanin2) )
            if ( pProb[pFanin->Id] > pProb[pFanin2->Id] )
            {
                Vec_PtrWriteEntry( vTimeCries, 1, pFanin2 );
                Vec_PtrWriteEntry( vTimeCries, 2, pFanin );
            }
            pFanin = (Abc_Obj_t *)Vec_PtrEntry( vTimeCries, 0 );
            pFanin2 = (Abc_Obj_t *)Vec_PtrEntry( vTimeCries, 1 );
//            if ( Abc_ObjSlack(pFanin) < Abc_ObjSlack(pFanin2) )
            if ( pProb[pFanin->Id] > pProb[pFanin2->Id] )
            {
                Vec_PtrWriteEntry( vTimeCries, 0, pFanin2 );
                Vec_PtrWriteEntry( vTimeCries, 1, pFanin );
            }
        }
        // add choice
        Abc_NtkSpeedupNode( pNtk, pNtkNew, pNode, vTimeFanins, vTimeCries );
    }
    Vec_PtrFree( vTimeCries );
    Vec_PtrFree( vTimeFanins );
    ABC_FREE( puPCEdges );
    if ( fVerbose )
        printf( "Nodes: Total = %7d. Power-critical = %7d. Workable = %7d. Ratio = %4.2f\n", 
            Abc_NtkNodeNum(pNtk), Counter, CounterRes, 1.0*CounterRes/Counter ); 

    // remove invalid choice nodes
    Abc_AigForEachAnd( pNtkNew, pNode, i )
        if ( pNode->pData )
        {
            if ( Abc_ObjFanoutNum((Abc_Obj_t *)pNode->pData) > 0 )
                pNode->pData = NULL;
        }

    // return the result
    Vec_IntFree( vProbs );
    return pNtkNew;
}